

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_compressionJob(void *jobDescription)

{
  uint uVar1;
  long lVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  ZSTD_customMem customMem;
  int iVar6;
  ZSTD_CCtx *cctx;
  size_t sVar8;
  unsigned_long_long *puVar9;
  ulong uVar10;
  void *src;
  void *dst;
  long *plVar11;
  ZSTD_CCtx *cctx_00;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  pthread_mutex_t *ppVar16;
  long lVar17;
  bool bVar18;
  buffer_t bVar19;
  buffer_t buf;
  undefined8 in_stack_fffffffffffffec0;
  ZSTD_CCtx *cctx_01;
  undefined8 in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  ldmState_t *ldmState;
  ulong local_120;
  rawSeqStore_t local_f8;
  size_t local_d8;
  size_t sStack_d0;
  ZSTD_CCtx_params jobParams;
  rawSeq *prVar7;
  
  memcpy(&jobParams,(void *)((long)jobDescription + 200),0x90);
  ppVar16 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
  pthread_mutex_lock(ppVar16);
  iVar6 = *(int *)((long)ppVar16 + 0x2c);
  if ((long)iVar6 == 0) {
    pthread_mutex_unlock(ppVar16);
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffec8;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffec0;
    customMem.opaque = in_stack_fffffffffffffed0;
    cctx = ZSTD_createCCtx_advanced(customMem);
  }
  else {
    *(int *)((long)ppVar16 + 0x2c) = iVar6 + -1;
    cctx = *(ZSTD_CCtx **)((long)ppVar16 + (long)iVar6 * 8 + 0x40);
    pthread_mutex_unlock(ppVar16);
  }
  if ((*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78))->bufferSize == 0) {
    prVar7 = (rawSeq *)0x0;
    local_120 = 0;
  }
  else {
    bVar19 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78));
    prVar7 = (rawSeq *)bVar19.start;
    local_120 = bVar19.capacity / 0xc;
  }
  sStack_d0 = 0;
  local_d8 = 0;
  cctx_01 = cctx;
  plVar11 = (long *)jobDescription;
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_00154f68:
    pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
    *(undefined8 *)((long)jobDescription + 8) = 0xffffffffffffffc0;
LAB_001553be:
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  }
  else {
    if (*(void **)((long)jobDescription + 0x88) == (void *)0x0) {
      bVar19 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x70));
      if (bVar19.start == (void *)0x0) goto LAB_00154f68;
      *(buffer_t *)((long)jobDescription + 0x88) = bVar19;
      cctx_00 = cctx_01;
    }
    else {
      bVar19.capacity = *(size_t *)((long)jobDescription + 0x90);
      bVar19.start = *(void **)((long)jobDescription + 0x88);
      cctx_00 = cctx;
    }
    dst = bVar19.start;
    if ((jobParams.ldmParams.enableLdm != 0) && (cctx_01 = cctx_00, prVar7 == (rawSeq *)0x0))
    goto LAB_00154f68;
    if (*(int *)((long)jobDescription + 0xb8) != 0) {
      jobParams.fParams.checksumFlag = 0;
    }
    jobParams.ldmParams.enableLdm = 0;
    if (*(ZSTD_CDict **)((long)jobDescription + 0x158) == (ZSTD_CDict *)0x0) {
      bVar18 = *(int *)((long)jobDescription + 0xbc) == 0;
      puVar9 = (unsigned_long_long *)((long)jobDescription + 0x160);
      if (bVar18) {
        puVar9 = (unsigned_long_long *)((long)jobDescription + 0xb0);
      }
      jobParams.forceWindow = (int)bVar18;
      sVar8 = ZSTD_compressBegin_advanced_internal
                        (cctx,*(void **)((long)jobDescription + 0x98),
                         *(size_t *)((long)jobDescription + 0xa0),ZSTD_dct_rawContent,ZSTD_dtlm_fast
                         ,(ZSTD_CDict *)0x0,&jobParams,*puVar9);
      cctx_01 = cctx_00;
      if (sVar8 < 0xffffffffffffff89) goto LAB_0015503b;
LAB_0015533f:
      pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
LAB_001553ba:
      plVar11[1] = sVar8;
      goto LAB_001553be;
    }
    sVar8 = ZSTD_compressBegin_advanced_internal
                      (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                       *(ZSTD_CDict **)((long)jobDescription + 0x158),&jobParams,
                       *(unsigned_long_long *)((long)jobDescription + 0x160));
    if (*(int *)((long)jobDescription + 0xbc) == 0) {
      __assert_fail("job->firstJob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d07,"void ZSTDMT_compressionJob(void *)");
    }
    cctx_01 = cctx_00;
    if (0xffffffffffffff88 < sVar8) goto LAB_0015533f;
LAB_0015503b:
    ppVar16 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
    local_f8.pos = local_d8;
    local_f8.size = sStack_d0;
    pvVar15 = *(void **)((long)jobDescription + 0xa8);
    uVar10 = *(ulong *)((long)jobDescription + 0xb0);
    uVar1 = *(uint *)((long)jobDescription + 0xb8);
    local_f8.capacity = local_120;
    local_f8.seq = prVar7;
    pthread_mutex_lock(ppVar16);
    while (*(uint *)((long)ppVar16 + 0x180) < uVar1) {
      pthread_cond_wait((pthread_cond_t *)(ppVar16 + 1),ppVar16);
    }
    cctx_01 = cctx_00;
    if (*(uint *)((long)ppVar16 + 0x180) == uVar1) {
      if (*(int *)((long)ppVar16 + 0xb8) != 0) {
        if ((((prVar7 == (rawSeq *)0x0) || (local_f8.pos != 0)) || (local_f8.size != 0)) ||
           (local_120 == 0)) {
          __assert_fail("seqStore.seq != NULL && seqStore.pos == 0 && seqStore.size == 0 && seqStore.capacity > 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c90,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        if (*(ulong *)((long)ppVar16 + 0xa8) < uVar10) {
          __assert_fail("src.size <= serialState->params.jobSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c91,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        ldmState = (ldmState_t *)((long)ppVar16 + 0xe8);
        ZSTD_window_update((ZSTD_window_t *)ldmState,pvVar15,uVar10);
        sVar8 = ZSTD_ldm_generateSequences
                          (ldmState,&local_f8,(ldmParams_t *)((long)ppVar16 + 0xb8),pvVar15,uVar10);
        if (0xffffffffffffff88 < sVar8) {
          __assert_fail("!ZSTD_isError(error)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c97,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        pthread_mutex_lock((pthread_mutex_t *)((long)ppVar16 + 0x188));
        pBVar3 = (ldmState->window).base;
        pBVar4 = (ldmState->window).dictBase;
        uVar5 = *(undefined8 *)&(ldmState->window).dictLimit;
        ppVar16[0xc].__align = (long)(ldmState->window).nextSrc;
        *(BYTE **)((long)ppVar16 + 0x1e8) = pBVar3;
        *(BYTE **)((long)ppVar16 + 0x1f0) = pBVar4;
        *(undefined8 *)((long)ppVar16 + 0x1f8) = uVar5;
        pthread_cond_signal((pthread_cond_t *)((long)ppVar16 + 0x1b0));
        pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar16 + 0x188));
      }
      cctx_01 = cctx_00;
      if (uVar10 != 0 && *(int *)((long)ppVar16 + 0x7c) != 0) {
        ZSTD_XXH64_update((XXH64_state_t *)((long)ppVar16 + 0x128),pvVar15,uVar10);
      }
    }
    *(int *)((long)ppVar16 + 0x180) = *(int *)((long)ppVar16 + 0x180) + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar16 + 1));
    pthread_mutex_unlock(ppVar16);
    if (local_f8.size != 0) {
      sVar8 = ZSTD_referenceExternalSequences(cctx_00,local_f8.seq,local_f8.size);
      if (*(int *)((long)ppVar16 + 0xb8) == 0) {
        __assert_fail("serialState->params.ldmParams.enableLdm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4cab,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
      if (0xffffffffffffff88 < sVar8) {
        __assert_fail("!ZSTD_isError(err)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4cac,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
    }
    if (*(int *)((long)jobDescription + 0xbc) == 0) {
      sVar8 = ZSTD_compressContinue
                        (cctx_00,dst,bVar19.capacity,*(void **)((long)jobDescription + 0xa8),0);
      if (0xffffffffffffff88 < sVar8) goto LAB_0015533f;
      ZSTD_invalidateRepCodes(cctx_00);
    }
    if (0x7ffffffe < *(ulong *)((long)jobDescription + 0xb0) >> 0x13) {
      __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d28,"void ZSTDMT_compressionJob(void *)");
    }
    if (*(long *)((long)jobDescription + 8) != 0) {
      __assert_fail("job->cSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d2a,"void ZSTDMT_compressionJob(void *)");
    }
    pvVar15 = (void *)(bVar19.capacity + (long)dst);
    lVar2 = *(long *)((long)jobDescription + 0xa8);
    iVar6 = (int)(*(ulong *)((long)jobDescription + 0xb0) + 0x7ffff >> 0x13);
    lVar12 = 1;
    lVar17 = 0x80000;
    while( true ) {
      ppVar16 = (pthread_mutex_t *)((long)jobDescription + 0x10);
      src = (void *)(lVar2 + lVar17 + -0x80000);
      if (iVar6 <= lVar12) break;
      sVar8 = ZSTD_compressContinue(cctx_01,dst,(long)pvVar15 - (long)dst,src,0x80000);
      if (0xffffffffffffff88 < sVar8) {
        pthread_mutex_lock(ppVar16);
        goto LAB_001553ba;
      }
      dst = (void *)((long)dst + sVar8);
      if (pvVar15 <= dst) {
        __assert_fail("op < oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4d2f,"void ZSTDMT_compressionJob(void *)");
      }
      pthread_mutex_lock(ppVar16);
      plVar11[1] = plVar11[1] + sVar8;
      *plVar11 = lVar17;
      pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
      pthread_mutex_unlock(ppVar16);
      lVar12 = lVar12 + 1;
      lVar17 = lVar17 + 0x80000;
    }
    if (0 < iVar6 || (int)plVar11[0x18] != 0) {
      uVar10 = plVar11[0x16];
      uVar13 = (ulong)((uint)uVar10 & 0x7ffff);
      uVar14 = uVar13;
      if ((uVar10 & 0x7ffff) == 0) {
        uVar14 = 0x80000;
      }
      if (uVar10 < 0x80000) {
        uVar14 = uVar13;
      }
      if ((int)plVar11[0x18] == 0) {
        uVar10 = ZSTD_compressContinue(cctx_01,dst,(long)pvVar15 - (long)dst,src,uVar14);
      }
      else {
        uVar10 = ZSTD_compressEnd(cctx_01,dst,(long)pvVar15 - (long)dst,src,uVar14);
      }
      if (uVar10 < 0xffffffffffffff89) goto LAB_001553c9;
      pthread_mutex_lock(ppVar16);
      plVar11[1] = uVar10;
      goto LAB_001553be;
    }
  }
  uVar10 = 0;
LAB_001553c9:
  uVar14 = plVar11[1];
  ppVar16 = (pthread_mutex_t *)plVar11[0x10];
  uVar1 = *(uint *)(plVar11 + 0x17);
  pthread_mutex_lock(ppVar16);
  if (*(uint *)((long)ppVar16 + 0x180) <= uVar1) {
    if (uVar14 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(cSize)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4cb6,
                    "void ZSTDMT_serialState_ensureFinished(serialState_t *, unsigned int, size_t)")
      ;
    }
    *(uint *)((long)ppVar16 + 0x180) = uVar1 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar16 + 1));
    pthread_mutex_lock((pthread_mutex_t *)((long)ppVar16 + 0x188));
    iVar6 = ppVar16[0xc].__data.__lock - *(int *)((long)ppVar16 + 0x1e8);
    *(int *)((long)ppVar16 + 0x1fc) = iVar6;
    *(int *)((long)ppVar16 + 0x1f8) = iVar6;
    pthread_cond_signal((pthread_cond_t *)((long)ppVar16 + 0x1b0));
    pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar16 + 0x188));
  }
  pthread_mutex_unlock(ppVar16);
  buf.capacity = local_120 * 0xc;
  buf.start = prVar7;
  ZSTDMT_releaseBuffer((ZSTDMT_bufferPool *)plVar11[0xf],buf);
  if (cctx_01 != (ZSTD_CCtx *)0x0) {
    ppVar16 = (pthread_mutex_t *)plVar11[0xd];
    pthread_mutex_lock(ppVar16);
    iVar6 = *(int *)((long)ppVar16 + 0x2c);
    if (iVar6 < ppVar16[1].__data.__lock) {
      *(int *)((long)ppVar16 + 0x2c) = iVar6 + 1;
      *(ZSTD_CCtx **)((long)ppVar16 + (long)iVar6 * 8 + 0x48) = cctx_01;
    }
    else {
      ZSTD_freeCCtx(cctx_01);
    }
    pthread_mutex_unlock(ppVar16);
  }
  pthread_mutex_lock((pthread_mutex_t *)(plVar11 + 2));
  if (uVar10 != 0 && 0xffffffffffffff88 < (ulong)plVar11[1]) {
    __assert_fail("lastCBlockSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4d50,"void ZSTDMT_compressionJob(void *)");
  }
  plVar11[1] = plVar11[1] + uVar10;
  *plVar11 = plVar11[0x16];
  pthread_cond_signal((pthread_cond_t *)(plVar11 + 7));
  pthread_mutex_unlock((pthread_mutex_t *)(plVar11 + 2));
  return;
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd     (cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}